

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeRayQueryType(Builder *this)

{
  Id IVar1;
  Instruction *this_00;
  size_t in_RSI;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30 [3];
  Instruction *local_18;
  Instruction *type;
  Builder *this_local;
  
  type = (Instruction *)this;
  if (this->ray_query_type == (Instruction *)0x0) {
    this_00 = (Instruction *)Instruction::operator_new((Instruction *)0x38,in_RSI);
    IVar1 = getUniqueId(this);
    Instruction::Instruction(this_00,IVar1,0,OpTypeRayQueryKHR);
    this->ray_query_type = this_00;
    local_18 = this_00;
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_30,
               this_00);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,(value_type *)local_30);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_30)
    ;
    Module::mapInstruction(&this->module,local_18);
  }
  else {
    local_18 = this->ray_query_type;
  }
  IVar1 = Instruction::getResultId(local_18);
  return IVar1;
}

Assistant:

Id Builder::makeRayQueryType()
{
    Instruction* type;
    if (!ray_query_type)
    {
        type = new Instruction(getUniqueId(), NoType, OpTypeRayQueryKHR);
        ray_query_type = type;
        constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
        module.mapInstruction(type);
    } else
        type = ray_query_type;

    return type->getResultId();
}